

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O2

string * __thiscall
bsim::quad_value::binary_string_abi_cxx11_(string *__return_storage_ptr__,quad_value *this)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(this->value) {
  case '\0':
    pcVar2 = "0";
    paVar1 = &local_a;
    break;
  case '\x01':
    pcVar2 = "1";
    paVar1 = &local_9;
    break;
  case '\x02':
    pcVar2 = "x";
    paVar1 = &local_b;
    break;
  case '\x03':
    pcVar2 = "z";
    paVar1 = &local_c;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                  ,0x86,"std::string bsim::quad_value::binary_string() const");
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string binary_string() const {
      if (value == 1) {
        return "1";
      } else if (value == 0) {
        return "0";
      } else if (value == QBV_UNKNOWN_VALUE) {
        return "x";
      } else if (value == QBV_HIGH_IMPEDANCE_VALUE) {
        return "z";
      }
      assert(false);
    }